

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O0

void __thiscall NaConfigPart::NaConfigPart(NaConfigPart *this,char *szType)

{
  undefined4 *puVar1;
  size_t sVar2;
  void *pvVar3;
  char *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__NaConfigPart_00193f10;
  if (in_RSI == (char *)0x0) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0;
    __cxa_throw(puVar1,&NaException::typeinfo,0);
  }
  sVar2 = strlen(in_RSI);
  pvVar3 = operator_new__(sVar2 + 1);
  in_RDI[1] = pvVar3;
  strcpy((char *)in_RDI[1],in_RSI);
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  return;
}

Assistant:

NaConfigPart::NaConfigPart (const char* szType)
{
    if(NULL == szType)
        throw(na_null_pointer);
    szTypeName = new char[strlen(szType) + 1];
    strcpy(szTypeName, szType);

    szInstanceName = NULL;

    pSelfData = NULL;
}